

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O3

void __thiscall
agge::tests::VectorRasterizerTests::InPixelRectsAreProperlyRasterizedToCells
          (VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cell reference2 [1];
  cell reference1 [1];
  vector_rasterizer vr;
  cell local_f8;
  cell local_e8;
  string local_d8;
  LocationInfo local_b8;
  vector_rasterizer local_90;
  
  vector_rasterizer::vector_rasterizer(&local_90);
  vector_rasterizer::line(&local_90,0xf1a,0xa1a,0xf66,0xa1a);
  vector_rasterizer::line(&local_90,0xf66,0xa1a,0xf66,0xab3);
  vector_rasterizer::line(&local_90,0xf66,0xab3,0xf1a,0xab3);
  vector_rasterizer::line(&local_90,0xf1a,0xab3,0xf1a,0xa1a);
  local_e8.x = 0xf;
  local_e8.y = 10;
  local_e8.area = 0x5ad8;
  local_e8.cover = 0;
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b8,&local_d8,0x208);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_e8,&local_90._cells,&local_b8);
  paVar2 = &local_b8.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  vector_rasterizer::reset(&local_90);
  vector_rasterizer::line(&local_90,0x1126,0x651a,0x1126,0x659a);
  vector_rasterizer::line(&local_90,0x1126,0x659a,0x11e4,0x659a);
  vector_rasterizer::line(&local_90,0x11e4,0x659a,0x11e4,0x651a);
  vector_rasterizer::line(&local_90,0x11e4,0x651a,0x1126,0x651a);
  local_f8.x = 0x11;
  local_f8.y = 0x65;
  local_f8.area = -0xbe00;
  local_f8.cover = 0;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b8,&local_d8,0x218);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_f8,&local_90._cells,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_90._x_sorted_cells._begin != (cell *)0x0) {
    operator_delete__(local_90._x_sorted_cells._begin);
  }
  if (local_90._histogram_x._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_x._begin);
  }
  if (local_90._histogram_y._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_y._begin);
  }
  if (local_90._cells._begin != (cell *)0x0) {
    operator_delete__(local_90._cells._begin);
  }
  return;
}

Assistant:

test( InPixelRectsAreProperlyRasterizedToCells )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (76 x 153)
				vr.line(fp(15.1), fp(10.1), fp(15.4), fp(10.1));
				vr.line(fp(15.4), fp(10.1), fp(15.4), fp(10.7));
				vr.line(fp(15.4), fp(10.7), fp(15.1), fp(10.7));
				vr.line(fp(15.1), fp(10.7), fp(15.1), fp(10.1));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 15, 10, 2 * 11628, 0 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT (190 x 128)
				vr.line(fp(17.15), fp(101.1), fp(17.15), fp(101.6));
				vr.line(fp(17.15), fp(101.6), fp(17.89), fp(101.6));
				vr.line(fp(17.89), fp(101.6), fp(17.89), fp(101.1));
				vr.line(fp(17.89), fp(101.1), fp(17.15), fp(101.1));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 17, 101, -2 * 24320, 0 },
				};

				assert_equal(reference2, vr.cells());
			}